

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::submit::submit(submit *this)

{
  uint *puVar1;
  allocator local_31;
  string local_30;
  
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0xc0);
  std::__cxx11::string::string((string *)&local_30,"submit",&local_31);
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__002b5348,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)&PTR__submit_002b5270;
  *(undefined ***)&(this->super_base_html_input).field_0xc0 = &PTR_render_002b52f0;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0;
  (this->super_base_html_input).field_0x38 = 0;
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)&(this->super_base_html_input).field_0x40);
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

submit::submit() : 
	base_html_input("submit"),
	pressed_(false)
{
	set(true);
}